

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleQualifierRenderCase::
getIterationDescription_abi_cxx11_(string *__return_storage_ptr__,void *this,int iteration)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(iteration) {
  case 0:
    __s = "Test with float varying";
    __a = &local_9;
    break;
  case 1:
    __s = "Test with vec2 varying";
    __a = &local_a;
    break;
  case 2:
    __s = "Test with vec3 varying";
    __a = &local_b;
    break;
  case 3:
    __s = "Test with vec4 varying";
    __a = &local_c;
    break;
  case 4:
    __s = "Test with array varying";
    __a = &local_d;
    break;
  case 5:
    __s = "Test with struct varying";
    __a = &local_e;
    break;
  default:
    __s = SSBOArrayLengthTests::init::arraysSized + 1;
    __a = &local_f;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string	SampleQualifierRenderCase::getIterationDescription (int iteration) const
{
	if (iteration == 0)
		return "Test with float varying";
	else if (iteration == 1)
		return "Test with vec2 varying";
	else if (iteration == 2)
		return "Test with vec3 varying";
	else if (iteration == 3)
		return "Test with vec4 varying";
	else if (iteration == 4)
		return "Test with array varying";
	else if (iteration == 5)
		return "Test with struct varying";

	DE_ASSERT(false);
	return "";
}